

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

int Gia_SimRsbResubVerify(Gia_SimRsbMan_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  word *pIn1;
  word *pIn2;
  int Res;
  word *pTruth1;
  word *pTruth0;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Gia_SimRsbMan_t *p_local;
  
  pIn1 = Gia_SimRsbFunc(p,iObj,p->vFanins,0);
  pIn2 = Gia_SimRsbFunc(p,iObj,p->vFanins,1);
  iVar1 = Abc_TtIntersect(pIn1,pIn2,p->nWords,0);
  if (pIn1 != (word *)0x0) {
    free(pIn1);
  }
  if (pIn2 != (word *)0x0) {
    free(pIn2);
  }
  return (uint)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

int Gia_SimRsbResubVerify( Gia_SimRsbMan_t * p, int iObj, Vec_Int_t * vFanins )
{
    word * pTruth0 = Gia_SimRsbFunc( p, iObj, p->vFanins, 0 );
    word * pTruth1 = Gia_SimRsbFunc( p, iObj, p->vFanins, 1 );
    int Res = !Abc_TtIntersect( pTruth0, pTruth1, p->nWords, 0 );
    ABC_FREE( pTruth0 );
    ABC_FREE( pTruth1 );
    return Res;
}